

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O1

void __thiscall iqxmlrpc::Pool_executor_factory::~Pool_executor_factory(Pool_executor_factory *this)

{
  pointer ppPVar1;
  _Elt_pointer ppPVar2;
  _Map_pointer pppPVar3;
  _Elt_pointer ppPVar4;
  pointer ppPVar5;
  _Elt_pointer ppPVar6;
  scoped_lock lk;
  unique_lock<boost::mutex> local_40;
  
  (this->super_Executor_factory_base)._vptr_Executor_factory_base =
       (_func_int **)&PTR__Pool_executor_factory_001894d0;
  destruction_started(this);
  boost::thread_group::join_all(&this->threads);
  ppPVar1 = (this->pool).
            super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar5 = (this->pool).
                 super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppPVar5 != ppPVar1;
      ppPVar5 = ppPVar5 + 1) {
    if (*ppPVar5 != (Pool_thread *)0x0) {
      operator_delete(*ppPVar5,0x10);
    }
  }
  local_40.is_locked = false;
  local_40.m = &this->req_queue_lock;
  boost::unique_lock<boost::mutex>::lock(&local_40);
  ppPVar4 = (this->req_queue).
            super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppPVar2 = (this->req_queue).
            super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppPVar4 != ppPVar2) {
    ppPVar6 = (this->req_queue).
              super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppPVar3 = (this->req_queue).
               super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (*ppPVar4 != (Pool_executor *)0x0) {
        (*((*ppPVar4)->super_Executor)._vptr_Executor[1])();
      }
      ppPVar4 = ppPVar4 + 1;
      if (ppPVar4 == ppPVar6) {
        ppPVar4 = pppPVar3[1];
        pppPVar3 = pppPVar3 + 1;
        ppPVar6 = ppPVar4 + 0x40;
      }
    } while (ppPVar4 != ppPVar2);
  }
  if (local_40.is_locked == true) {
    boost::mutex::unlock(local_40.m);
  }
  boost::mutex::~mutex(&this->destructor_lock);
  boost::condition_variable_any::~condition_variable_any(&this->req_queue_cond);
  boost::mutex::~mutex(&this->req_queue_lock);
  std::_Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>::
  ~_Deque_base(&(this->req_queue).
                super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>
              );
  ppPVar5 = (this->pool).
            super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar5 != (pointer)0x0) {
    operator_delete(ppPVar5,(long)(this->pool).
                                  super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar5
                   );
  }
  boost::thread_group::~thread_group(&this->threads);
  return;
}

Assistant:

Pool_executor_factory::~Pool_executor_factory()
{
  destruction_started();
  threads.join_all();

  util::delete_ptrs(pool.begin(), pool.end());
  scoped_lock lk(req_queue_lock);
  util::delete_ptrs(req_queue.begin(), req_queue.end());
}